

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O3

optional<Token> * __thiscall
Analyser::nextToken(optional<Token> *__return_storage_ptr__,Analyser *this)

{
  ulong uVar1;
  pointer pTVar2;
  _func_void__Op_any_ptr__Arg_ptr *p_Var3;
  bool bVar4;
  uint64_t uVar5;
  _Arg __arg;
  _Arg local_18;
  
  uVar1 = this->_offset;
  pTVar2 = (this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar1 < (ulong)((long)(this->_tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 5)) {
    uVar5 = pTVar2[uVar1]._lineNumber;
    this->_currentLine = (int32_t)uVar5;
    this->_offset = uVar1 + 1;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._type = pTVar2[uVar1]._type;
    local_18._M_obj =
         &(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_payload._M_value._value;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._value._M_storage._M_ptr = (void *)0x0;
    p_Var3 = pTVar2[uVar1]._value._M_manager;
    if (p_Var3 == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (local_18._M_any)->_M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    else {
      (*p_Var3)(_Op_clone,&pTVar2[uVar1]._value,&local_18);
      uVar5 = pTVar2[uVar1]._lineNumber;
    }
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._lineNumber = uVar5;
    bVar4 = true;
  }
  else {
    this->_offset = uVar1 + 1;
    bVar4 = false;
  }
  (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
  super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>._M_engaged
       = bVar4;
  return __return_storage_ptr__;
}

Assistant:

std::optional<Token> Analyser::nextToken() {
	if (_offset >= _tokens.size()) {
		_offset++;
		return {};
	}

	_currentLine = _tokens[_offset].GetLine();
	return _tokens[_offset++];
}